

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O0

bool __thiscall ON_Interval::Includes(ON_Interval *this,ON_Interval *other,bool bProperSubSet)

{
  bool bVar1;
  bool local_1b;
  bool local_1a;
  bool rc;
  bool bProperSubSet_local;
  ON_Interval *other_local;
  ON_Interval *this_local;
  
  bVar1 = Includes(this,other->m_t[0],false);
  local_1b = false;
  if (bVar1) {
    local_1b = Includes(this,other->m_t[1],false);
  }
  local_1a = (bool)(-local_1b & 1);
  if ((((local_1a != false) && (bProperSubSet)) &&
      (bVar1 = Includes(this,other->m_t[0],true), !bVar1)) &&
     (bVar1 = Includes(this,other->m_t[1],true), !bVar1)) {
    local_1a = false;
  }
  return local_1a;
}

Assistant:

bool
ON_Interval::Includes( const ON_Interval& other, bool bProperSubSet ) const
{
  bool rc = ( Includes( other.m_t[0] ) && Includes( other.m_t[1] ) ) ? true : false;
  if ( rc && bProperSubSet )
  {
    if ( !Includes( other.m_t[0], true ) && !Includes( other.m_t[1], true ) )
      rc = false;
  }
  return rc;
}